

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O0

void __thiscall ll_grammar::ElemLeft::ElemLeft(ElemLeft *this,string *name,int key,bool isFinally)

{
  string local_40 [35];
  byte local_1d;
  int local_1c;
  bool isFinally_local;
  string *psStack_18;
  int key_local;
  string *name_local;
  ElemLeft *this_local;
  
  local_1d = isFinally;
  local_1c = key;
  psStack_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)name);
  base_grammar::Elem::Elem(&this->super_Elem,(string *)local_40,local_1c,(bool)(local_1d & 1));
  std::__cxx11::string::~string(local_40);
  std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>::vector
            (&this->expression_of_set);
  return;
}

Assistant:

ElemLeft::ElemLeft(string name, int key, bool isFinally) : Elem(name, key, isFinally){}